

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

string * __thiscall
httplib::detail::random_string_abi_cxx11_(string *__return_storage_ptr__,detail *this,size_t length)

{
  pointer pcVar1;
  int iVar2;
  detail *pdVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)this);
  if (this != (detail *)0x0) {
    pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    pdVar3 = (detail *)0x0;
    do {
      iVar2 = rand();
      pdVar3[(long)pcVar1] =
           *(detail *)
            ("0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz" +
            (ulong)(long)iVar2 % 0x3e);
      pdVar3 = pdVar3 + 1;
    } while (this != pdVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string random_string(size_t length) {
  auto randchar = []() -> char {
    const char charset[] = "0123456789"
                           "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                           "abcdefghijklmnopqrstuvwxyz";
    const size_t max_index = (sizeof(charset) - 1);
    return charset[static_cast<size_t>(rand()) % max_index];
  };
  std::string str(length, 0);
  std::generate_n(str.begin(), length, randchar);
  return str;
}